

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_file_access_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int local_68;
  int local_60;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((ulong)in_R8 & 1) == 1) {
        auVar1._8_8_ = (long)in_R8 >> 0x3f;
        auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_60 = SUB164(auVar1 / SEXT816(2),0);
      }
      else {
        if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
          local_68 = (int)(char)in_R8[2] * (int)*(undefined8 *)(in_R8 + 6);
        }
        else {
          local_68 = 0;
        }
        local_60 = local_68;
      }
      iVar2 = access((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),local_60);
      local_8 = (sexp_conflict)sexp_make_integer(in_RDI,(long)iVar2,(long)iVar2 >> 0x3f);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_file_access_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_integer(ctx, access(sexp_string_data(arg0), sexp_sint_value(arg1)));
  return res;
}